

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_landscapes.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  value_type *__x;
  long lVar4;
  size_t dimension;
  bool bVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  char *local_200 [4];
  Persistence_landscape l;
  stringstream ss;
  ostream local_1a8 [376];
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
                          );
  poVar3 = std::operator<<(poVar3,"provided as an input.\n");
  poVar3 = std::operator<<(poVar3,
                           "The first parameter of this program is a dimension of persistence that will be used in creation of "
                          );
  poVar3 = std::operator<<(poVar3,"the persistence heat maps.");
  poVar3 = std::operator<<(poVar3,
                           "If your input files contains persistence pairs of various dimension, as a first parameter of the "
                          );
  poVar3 = std::operator<<(poVar3,
                           "procedure please provide the dimension of persistence you want to use.")
  ;
  poVar3 = std::operator<<(poVar3,
                           "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
                          );
  poVar3 = std::operator<<(poVar3,"-1.\n");
  std::operator<<(poVar3,
                  "The remaining parameters are the names of files with persistence diagrams. \n");
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
    iVar2 = 1;
  }
  else {
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = atoi(argv[1]);
    dimension = 0xffffffff;
    if (-1 < (int)uVar1) {
      dimension = (size_t)uVar1;
    }
    lVar4 = (ulong)(uint)argc - 2;
    __x = argv + 2;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&filenames,__x);
      __x = __x + 1;
    }
    for (lVar4 = 0;
        lVar4 != (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3; lVar4 = lVar4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::clog,"Creating a landscape based on file : ");
      poVar3 = std::operator<<(poVar3,filenames.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::endl<char,std::char_traits<char>>(poVar3);
      Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
                (&l,filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar4],dimension,0xffffffffffffffff);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a8,
                               filenames.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::operator<<(poVar3,".land");
      std::__cxx11::stringbuf::str();
      Gudhi::Persistence_representations::Persistence_landscape::print_to_file(&l,local_200[0]);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::~vector(&l.land);
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
            << "provided as an input.\n"
            << "The first parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a first parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 3) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  std::vector<const char*> filenames;
  int dim = atoi(argv[1]);
  unsigned dimension = std::numeric_limits<unsigned>::max();
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a landscape based on file : " << filenames[i] << std::endl;
    Persistence_landscape l(filenames[i], dimension);
    std::stringstream ss;
    ss << filenames[i] << ".land";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}